

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

uint __thiscall
CVmHashFuncComparator::compute_hash(CVmHashFuncComparator *this,char *str,size_t len)

{
  vm_obj_id_t obj;
  vm_val_t *pvVar1;
  vm_rcdesc *in_RSI;
  char *in_RDI;
  vm_rcdesc rc;
  vm_val_t cobj_val;
  vm_val_t val;
  char *in_stack_ffffffffffffff68;
  vm_rcdesc *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffffb4;
  vm_val_t *in_stack_ffffffffffffffb8;
  vm_prop_id_t in_stack_ffffffffffffffc6;
  vm_val_t *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd4;
  CVmRun *in_stack_ffffffffffffffd8;
  uint local_20;
  
  vm_rcdesc::vm_rcdesc((vm_rcdesc *)&stack0xffffffffffffff80);
  vm_rcdesc::init_ret(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  pvVar1 = CVmStack::push();
  obj = CVmObjString::create(in_stack_ffffffffffffff84,in_RDI,(size_t)pvVar1);
  vm_val_t::set_obj(pvVar1,obj);
  vm_val_t::set_obj((vm_val_t *)&stack0xffffffffffffffc8,*(vm_obj_id_t *)(in_RDI + 8));
  CVmRun::get_prop(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8,
                   in_stack_ffffffffffffffc6,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                   in_RSI);
  pvVar1 = CVmRun::get_r0();
  if ((int)*(undefined8 *)pvVar1 == 7) {
    local_20 = (pvVar1->val).obj;
    return local_20;
  }
  err_throw(0);
}

Assistant:

unsigned int compute_hash(const char *str, size_t len) const
    {
        vm_val_t val;
        vm_val_t cobj_val;
        VMGLOB_PTR(globals_);

        /* set up a recursive call context */
        vm_rcdesc rc;
        rc.init_ret(vmg_ "HashComparator.calcHash");

        /* create a string object to represent the argument, and push it */
        G_stk->push()->set_obj(CVmObjString::create(vmg_ FALSE, str, len));

        /* invoke the calcHash method */
        cobj_val.set_obj(comparator_);
        G_interpreter->get_prop(vmg_ 0, &cobj_val, G_predef->calc_hash_prop,
                                &cobj_val, 1, &rc);

        /* retrieve the result from R0 */
        val = *G_interpreter->get_r0();

        /* we need an integer value from the method */
        if (val.typ == VM_INT)
        {
            /* return the hash value from the comparator */
            return val.val.intval;
        }
        else
        {
            /* no or invalid hash value - throw an error */
            err_throw(VMERR_BAD_TYPE_BIF);
            AFTER_ERR_THROW(return FALSE;)
        }
    }